

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall CTcTokenizer::pragma_newline_spacing(CTcTokenizer *this)

{
  long *plVar1;
  tc_toktyp_t tVar2;
  int iVar3;
  newline_spacing_mode_t nVar4;
  char *__s2;
  char *__s1;
  size_t sStack_20;
  
  if ((undefined1  [3440])((undefined1  [3440])*this & (undefined1  [3440])0x4) !=
      (undefined1  [3440])0x0) {
    return;
  }
  tVar2 = next_on_line(this);
  if ((tVar2 != TOKT_LPAR) || (tVar2 = next_on_line(this), tVar2 != TOKT_SYM))
  goto switchD_0024e4ff_caseD_4;
  switch((this->curtok_).text_len_) {
  case 2:
    if (*(short *)(this->curtok_).text_ == 0x6e6f) {
LAB_0024e56b:
      nVar4 = NEWLINE_SPACING_COLLAPSE;
      goto LAB_0024e56e;
    }
    break;
  case 3:
    __s1 = (this->curtok_).text_;
    __s2 = "off";
    sStack_20 = 3;
    goto LAB_0024e534;
  case 6:
    __s1 = (this->curtok_).text_;
    __s2 = "delete";
    sStack_20 = 6;
LAB_0024e534:
    iVar3 = bcmp(__s1,__s2,sStack_20);
    if (iVar3 == 0) {
      nVar4 = NEWLINE_SPACING_DELETE;
LAB_0024e56e:
      tVar2 = next_on_line(this);
      if (tVar2 == TOKT_RPAR) {
        this->string_newline_spacing_ = nVar4;
        goto LAB_0024e58c;
      }
    }
    break;
  case 8:
    plVar1 = (long *)(this->curtok_).text_;
    if (*plVar1 == 0x657370616c6c6f63) goto LAB_0024e56b;
    if (*plVar1 != 0x6576726573657270) break;
    nVar4 = NEWLINE_SPACING_PRESERVE;
    goto LAB_0024e56e;
  }
switchD_0024e4ff_caseD_4:
  log_warning(0x271f);
LAB_0024e58c:
  clear_linebuf(this);
  return;
}

Assistant:

void CTcTokenizer::pragma_newline_spacing()
{
    newline_spacing_mode_t f;

    /* if we're in preprocess-only mode, just pass the pragma through */
    if (pp_only_mode_)
        return;
    
    /* get the '(' token and the on/off token */
    if (next_on_line() != TOKT_LPAR || next_on_line() != TOKT_SYM)
    {
        log_warning(TCERR_BAD_PRAGMA_SYNTAX);
        goto done;
    }

    /* note the new mode flag */
    if (curtok_.get_text_len() == 2
        && memcmp(curtok_.get_text(), "on", 2) == 0)
    {
        /* 'on' - this is the old version of 'collapse' */
        f = NEWLINE_SPACING_COLLAPSE;
    }
    else if (curtok_.get_text_len() == 8
             && memcmp(curtok_.get_text(), "collapse", 8) == 0)
    {
        f = NEWLINE_SPACING_COLLAPSE;
    }
    else if (curtok_.get_text_len() == 3
             && memcmp(curtok_.get_text(), "off", 3) == 0)
    {
        /* 'off' - the old version of 'delete' */
        f = NEWLINE_SPACING_DELETE;
    }
    else if (curtok_.get_text_len() == 6
             && memcmp(curtok_.get_text(), "delete", 6) == 0)
    {
        f = NEWLINE_SPACING_DELETE;
    }
    else if (curtok_.get_text_len() == 8
             && memcmp(curtok_.get_text(), "preserve", 8) == 0)
    {
        f = NEWLINE_SPACING_PRESERVE;
    }
    else
    {
        log_warning(TCERR_BAD_PRAGMA_SYNTAX);
        goto done;
    }

    /* make sure we have the ')' token */
    if (next_on_line() != TOKT_RPAR)
    {
        log_warning(TCERR_BAD_PRAGMA_SYNTAX);
        goto done;
    }

    /* set the new mode */
    string_newline_spacing_ = f;

done:
    /* done - discard this line buffer */
    clear_linebuf();
}